

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void xPredIntraAngAdi_X_8(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  pel pVar4;
  pel pVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  undefined8 local_100;
  pel first_line [192];
  
  iVar6 = (int)((long)iHeight / 2);
  uVar10 = (iVar6 + iWidth) - 1;
  uVar12 = iWidth * 2 + 1;
  uVar7 = uVar12;
  if ((int)uVar10 < (int)uVar12) {
    uVar7 = uVar10;
  }
  lVar8 = (long)(int)(iVar6 + iWidth + 0xeU & 0xfffffff0);
  uVar13 = 0;
  uVar9 = 0;
  if (0 < (int)uVar7) {
    uVar9 = (ulong)uVar7;
  }
  for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    bVar1 = pSrc[uVar13 + 1];
    bVar2 = pSrc[uVar13 + 2];
    bVar3 = pSrc[uVar13 + 3];
    first_line[uVar13] =
         (pel)((uint)pSrc[uVar13] + (uint)bVar3 + ((uint)bVar2 + (uint)bVar1) * 3 + 4 >> 3);
    first_line[uVar13 + lVar8] = (pel)((uint)bVar1 + (uint)bVar2 * 2 + (uint)bVar3 + 2 >> 2);
  }
  if ((int)uVar12 < (int)uVar10) {
    lVar11 = (long)(int)uVar7;
    pVar4 = first_line[lVar11 + lVar8 + -2];
    first_line[lVar11 + lVar8 + -1] = pVar4;
    pVar5 = first_line[lVar11 + -1];
    for (; (long)uVar9 < (long)(int)uVar10; uVar9 = uVar9 + 1) {
      first_line[uVar9] = pVar5;
      first_line[uVar9 + lVar8] = pVar4;
    }
  }
  local_100 = (long)i_dst;
  uVar13 = 0;
  uVar9 = (long)iHeight / 2 & 0xffffffff;
  if (iVar6 < 1) {
    uVar9 = uVar13;
  }
  for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    memcpy(dst,first_line + uVar13,(long)iWidth);
    memcpy(dst + local_100,first_line + uVar13 + lVar8,(long)iWidth);
    dst = dst + i_dst * 2;
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_X_8(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[2 * (64 + 32)]);
    int line_size = iWidth + iHeight / 2 - 1;
    int real_size = min(line_size, iWidth * 2 + 1);
    int i;
    int aligned_line_size = ((line_size + 15) >> 4) << 4;
    pel *pfirst[2] = { first_line, first_line + aligned_line_size };

    for (i = 0; i < real_size; i++, pSrc++) {
        pfirst[0][i] = (pSrc[0] + (pSrc[1] + pSrc[2]) * 3 + pSrc[3] + 4) >> 3;
        pfirst[1][i] = (pSrc[1] + pSrc[2] * 2 + pSrc[3] + 2) >> 2;
    }

    // padding
    if (real_size < line_size) {
        int pad1, pad2;

        pfirst[1][real_size - 1] = pfirst[1][real_size - 2];

        pad1 = pfirst[0][real_size - 1];
        pad2 = pfirst[1][real_size - 1];
        for (; i < line_size; i++) {
            pfirst[0][i] = pad1;
            pfirst[1][i] = pad2;
        }
    }

    iHeight /= 2;

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst[0] + i, iWidth * sizeof(pel));
        memcpy(dst + i_dst, pfirst[1] + i, iWidth * sizeof(pel));
        dst += i_dst * 2;
    }
}